

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O1

int picnic_impl_verify(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t siglen)

{
  undefined1 auVar1 [64];
  byte bVar2;
  byte bVar3;
  _Bool _Var4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  char cVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  undefined8 uVar14;
  sbyte sVar15;
  uint16_t uVar16;
  uint uVar17;
  uint uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  view_t *pvVar25;
  view_t *views;
  BitLength databitlen;
  int iVar26;
  int iVar27;
  int iVar28;
  uint8_t *salt;
  void *pvVar29;
  long lVar30;
  proof_round_t *prf_round;
  ulong uVar31;
  uint uVar32;
  uint8_t *puVar33;
  byte bVar34;
  uint uVar35;
  ulong uVar36;
  uint j_2;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  uint j;
  kdf_shake_x4_t *kdf;
  uint8_t *puVar43;
  uint i_2;
  uint uVar44;
  ushort *puVar45;
  byte *pbVar46;
  byte bVar47;
  uint j_5;
  uint uVar48;
  uint8_t *puVar49;
  mzd_local_t (*data) [1];
  kdf_shake_t *kdf_00;
  Keccak_HashInstance *instance;
  mzd_local_t *data_00;
  ulong uVar50;
  bool bVar51;
  undefined1 auVar52 [64];
  uint a_i;
  uint c_i_1;
  uint b_i_1;
  uint c_i;
  uint b_i;
  in_out_shares_t in_out_shares;
  uint8_t *seeds [4];
  uchar challenge [438];
  undefined1 local_980 [16];
  undefined1 *puStack_970;
  undefined1 *puStack_968;
  undefined1 auStack_960 [32];
  uint8_t *local_940;
  uint8_t *local_938;
  ulong local_930;
  uint local_924;
  ulong local_920;
  ulong local_918;
  view_t *local_910;
  uint8_t *local_908;
  view_t *local_900;
  uint local_8f8;
  int local_8f4;
  ulong local_8f0;
  ushort *local_8e8;
  zkbpp_lowmc_verify_implementation_f local_8e0;
  BitLength local_8d8;
  ulong local_8d0;
  uint8_t *local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined1 local_880 [40];
  long local_858;
  ulong local_850;
  ulong local_848;
  undefined1 local_840 [16];
  uint8_t *puStack_830;
  uint8_t *apuStack_828 [5];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 auStack_780 [64];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [128];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 auStack_5c0 [54];
  uchar local_58a [10];
  undefined1 auStack_580 [54];
  Keccak_HashInstancetimes4 local_3c8;
  
  bVar34 = pp->digest_size;
  uVar9 = pp->num_rounds;
  uVar31 = (ulong)uVar9;
  bVar2 = pp->input_output_size;
  uVar38 = (ulong)bVar2;
  bVar3 = pp->view_size;
  salt = (uint8_t *)calloc(1,(ulong)((uint)uVar9 * 0x90) + 0x28);
  lVar30 = 0;
  if (salt == (uint8_t *)0x0) {
    salt = (uint8_t *)0x0;
  }
  else {
    uVar44 = bVar3 + 7 & 0xfffffff8;
    uVar32 = (uint)bVar3 + (uint)bVar2 * 2;
    _Var4 = context->unruh;
    uVar37 = 0;
    if (_Var4 != false) {
      uVar37 = uVar32;
    }
    uVar36 = (ulong)(uVar9 + 7 & 0xfffffff8);
    pvVar29 = calloc(1,((uint)bVar2 + (uint)bVar2 * 4 + uVar44 + (uVar37 + bVar34) * 2) *
                       (uint)uVar9 + uVar36);
    *(void **)(salt + 0x20) = pvVar29;
    lVar30 = (long)pvVar29 + uVar36;
    if (uVar9 != 0) {
      puVar33 = salt + 0x40;
      uVar36 = 0;
      do {
        lVar40 = 0;
        do {
          *(long *)(puVar33 + lVar40 * 8) = lVar30;
          lVar30 = lVar30 + (ulong)bVar34;
          lVar40 = lVar40 + 1;
        } while (lVar40 == 1);
        uVar36 = uVar36 + 1;
        puVar33 = puVar33 + 0x90;
      } while (uVar36 != uVar31);
    }
    if (uVar9 != 0) {
      lVar40 = 0;
      do {
        *(long *)(salt + lVar40 + 0x70) = lVar30;
        lVar30 = lVar30 + (ulong)uVar44;
        lVar40 = lVar40 + 0x90;
      } while ((ulong)uVar9 * 0x90 != lVar40);
    }
    if (uVar31 != 0) {
      lVar40 = 0;
      do {
        *(long *)(salt + lVar40 + 0x88) = lVar30;
        *(ulong *)(salt + lVar40 + 0x90) = lVar30 + uVar38;
        lVar30 = lVar30 + uVar38 + uVar38;
        *(long *)(salt + lVar40 + 0x98) = lVar30;
        lVar30 = lVar30 + uVar38;
        lVar40 = lVar40 + 0x90;
      } while ((ulong)uVar9 * 0x90 != lVar40);
    }
    if (uVar9 != 0 && _Var4 == true) {
      puVar33 = salt + 0xa0;
      uVar36 = 0;
      do {
        lVar40 = 0;
        do {
          *(long *)(puVar33 + lVar40 * 8) = lVar30;
          lVar30 = lVar30 + (ulong)uVar32;
          lVar40 = lVar40 + 1;
        } while (lVar40 == 1);
        uVar36 = uVar36 + 1;
        puVar33 = puVar33 + 0x90;
      } while (uVar36 != uVar31);
    }
  }
  if (salt != (uint8_t *)0x0) {
    uVar36 = (ulong)(uVar9 + 7 + (uint)uVar9 >> 3);
    uVar42 = siglen - uVar36;
    if (uVar36 <= siglen) {
      bVar5 = pp->seed_size;
      bVar6 = (pp->lowmc).m;
      bVar7 = (pp->lowmc).r;
      uVar10 = (pp->lowmc).n;
      if (uVar31 == 0) {
        uVar36 = 0;
      }
      else {
        pbVar46 = *(byte **)(salt + 0x20);
        uVar37 = 0;
        uVar36 = 0;
        do {
          bVar47 = (byte)uVar36 & 6;
          bVar47 = (~(byte)(-1 << ((byte)(8 - bVar47) & 0x1f)) & sig[uVar36 >> 3]) >> (bVar47 ^ 6);
          if (bVar47 == 3) goto LAB_0011a8e0;
          uVar36 = uVar36 + 2;
          *pbVar46 = bVar47 >> 1 | bVar47 * '\x02' & 2;
          pbVar46 = pbVar46 + 1;
        } while ((uint)uVar9 + (uint)uVar9 != uVar36);
      }
      uVar32 = 8 - ((uint)uVar36 & 6);
      bVar47 = (byte)uVar32;
      sVar15 = (bVar47 < 0x21) * (' ' - bVar47);
      uVar37 = 0;
      if (((uint)sig[uVar36 >> 3] << sVar15) >> sVar15 == 0) {
        uVar37 = (uint)(uVar32 + uVar36 >> 3);
      }
LAB_0011a8e0:
      if ((uVar37 != 0) && (0x1f < uVar42)) {
        uVar42 = uVar42 - 0x20;
        puVar33 = sig + uVar37;
        uVar14 = *(undefined8 *)(puVar33 + 8);
        uVar19 = *(undefined8 *)(puVar33 + 0x10);
        uVar20 = *(undefined8 *)(puVar33 + 0x18);
        *(undefined8 *)salt = *(undefined8 *)puVar33;
        *(undefined8 *)(salt + 8) = uVar14;
        *(undefined8 *)(salt + 0x10) = uVar19;
        *(undefined8 *)(salt + 0x18) = uVar20;
        iVar26 = 3;
        if (uVar9 != 0) {
          puVar33 = salt + 0x28;
          puVar43 = sig + (ulong)uVar37 + 0x20;
          _Var4 = context->unruh;
          uVar37 = ~(0xff << ((uint)bVar2 * 8 - (uint)uVar10 & 0x1f));
          uVar36 = 0;
          do {
            cVar8 = *(char *)(*(long *)(salt + 0x20) + uVar36);
            bVar47 = bVar2;
            if (cVar8 == '\0') {
              bVar47 = 0;
            }
            uVar32 = 0;
            if (cVar8 == '\0') {
              uVar32 = (uint)bVar2;
            }
            uVar32 = uVar32 + (uint)bVar3 + (uint)bVar2;
            uVar44 = 0;
            if (_Var4 != false) {
              uVar44 = uVar32;
            }
            uVar50 = (ulong)(uVar44 + (uint)bVar47 + (uint)bVar34 + (uint)bVar3 + (uint)bVar5 * 2);
            bVar51 = uVar42 < uVar50;
            uVar42 = uVar42 - uVar50;
            iVar26 = 2;
            lVar40 = lVar30;
            if (bVar51) {
              bVar51 = false;
            }
            else {
              *(uint8_t **)(puVar33 + 0x28) = puVar43;
              puVar43 = puVar43 + bVar34;
              if (_Var4 != false) {
                *(uint8_t **)(puVar33 + 0x88) = puVar43;
                puVar43 = puVar43 + uVar32;
              }
              *(uint8_t **)(puVar33 + 0x50) = puVar43;
              if ((~(0xff << ((uint)bVar3 * 8 + (uint)bVar6 * (uint)bVar7 * -3 & 0x1f)) &
                  (uint)puVar43[bVar3 - 1]) == 0) {
                puVar43 = puVar43 + bVar3;
                *(uint8_t **)puVar33 = puVar43;
                *(uint8_t **)(puVar33 + 8) = puVar43 + bVar5;
                puVar43 = puVar43 + bVar5 + bVar5;
                if (cVar8 == '\x01') {
                  *(long *)(puVar33 + 0x30) = lVar30;
                  lVar40 = lVar30 + uVar38;
                  *(uint8_t **)(puVar33 + 0x38) = puVar43;
                  bVar51 = false;
                  if ((uVar37 & puVar43[bVar2 - 1]) == 0) {
LAB_0011ab2a:
                    puVar43 = puVar43 + uVar38;
                    lVar40 = lVar30 + uVar38;
                    bVar51 = true;
                    iVar26 = 0;
                  }
                }
                else if (cVar8 == '\0') {
                  *(long *)(puVar33 + 0x30) = lVar30;
                  *(ulong *)(puVar33 + 0x38) = lVar30 + uVar38;
                  iVar26 = 0;
                  bVar51 = true;
                  lVar40 = lVar30 + uVar38 + uVar38;
                }
                else {
                  *(uint8_t **)(puVar33 + 0x30) = puVar43;
                  bVar51 = false;
                  if ((uVar37 & puVar43[bVar2 - 1]) == 0) {
                    *(long *)(puVar33 + 0x38) = lVar30;
                    goto LAB_0011ab2a;
                  }
                }
              }
              else {
                bVar51 = false;
              }
            }
            if (!bVar51) goto LAB_0011ab4b;
            uVar36 = uVar36 + 1;
            puVar33 = puVar33 + 0x90;
            lVar30 = lVar40;
          } while (uVar31 != uVar36);
          iVar26 = 3;
        }
LAB_0011ab4b:
        if ((iVar26 != 2) && ((iVar26 != 3 || (uVar42 == 0)))) goto LAB_0011900a;
      }
    }
    free(*(void **)(salt + 0x20));
    free(salt);
  }
  salt = (uint8_t *)0x0;
LAB_0011900a:
  if (salt == (uint8_t *)0x0) {
    iVar26 = -1;
  }
  else {
    local_8f0 = (ulong)pp->num_rounds;
    local_930 = (ulong)pp->input_output_size;
    bVar34 = pp->view_size;
    uVar37 = bVar34 + 7;
    uVar44 = uVar37 & 0xfffffff8;
    uVar31 = (ulong)uVar44;
    uVar32 = (uint)pp->input_output_size * 8;
    local_920 = (ulong)uVar32;
    uVar9 = (pp->lowmc).n;
    local_8e0 = get_zkbpp_lowmc_verify_implementation(&pp->lowmc);
    lVar30 = (ulong)(pp->lowmc).r * 0x60;
    local_900 = (view_t *)aligned_alloc(0x20,lVar30);
    local_910 = (view_t *)aligned_alloc(0x20,lVar30);
    local_8e8 = (ushort *)malloc((ulong)(uint)((int)local_8f0 * 2));
    local_908 = (uint8_t *)aligned_alloc(8,uVar44 * 8);
    puVar33 = salt + 0x28;
    local_8d8 = (ulong)bVar34 << 3;
    local_918 = (ulong)((int)local_930 - 1);
    local_720 = vpbroadcastq_avx512vl();
    local_740 = vpbroadcastq_avx512vl();
    uVar37 = uVar37 >> 3;
    local_8d0 = (ulong)(uVar37 << 5);
    local_850 = (ulong)(uVar37 << 4);
    local_858 = uVar31 * 3;
    local_8c8 = salt + 0x58;
    local_940 = salt + 0xa0;
    uVar37 = 0;
    local_938 = puVar33;
    do {
      uVar38 = 0;
      if (local_8f0 != 0) {
        lVar30 = *(long *)(salt + 0x20);
        uVar42 = 0;
        uVar36 = 0;
        do {
          uVar38 = uVar36;
          if (uVar37 == *(byte *)(lVar30 + uVar42)) {
            uVar38 = (ulong)((int)uVar36 + 1);
            local_8e8[uVar36] = (ushort)uVar42;
          }
          uVar42 = uVar42 + 1;
          uVar36 = uVar38;
        } while (local_8f0 != uVar42);
      }
      local_924 = (uint)uVar38;
      uVar44 = local_924 & 0xfffffffc;
      bVar34 = (byte)(0xff << (uVar32 - uVar9 & 0x1f));
      puVar45 = local_8e8;
      if ((uVar38 & 0xfffffffc) == 0) {
        uVar44 = 0;
      }
      else {
        iVar26 = uVar37 + 1;
        uVar41 = 0;
        local_8f4 = 0;
        if (iVar26 != 3) {
          local_8f4 = iVar26;
        }
        iVar27 = uVar37 + 2 + ((uVar37 + 2) / 3) * -3;
        local_848 = (ulong)uVar44;
        do {
          uVar14 = *(undefined8 *)puVar45;
          uVar48 = (uint)uVar14 & 0xffff;
          uVar18 = (uint)((ulong)uVar14 >> 0x20) & 0xffff;
          local_980._0_8_ = uVar14;
          uVar17 = (uint)((ulong)uVar14 >> 0x10) & 0xffff;
          uVar10 = (ushort)((ulong)uVar14 >> 0x30);
          kdf = (kdf_shake_x4_t *)local_700;
          lVar30 = 0;
          local_8f8 = uVar41;
          do {
            uVar16 = (uint16_t)local_8f4;
            if (lVar30 == 0) {
              uVar16 = (uint16_t)uVar37;
            }
            local_840._0_8_ = *(undefined8 *)(puVar33 + lVar30 + (ulong)(uVar48 * 0x90));
            local_840._8_8_ = *(undefined8 *)(puVar33 + lVar30 + (ulong)(uVar17 * 0x90));
            puStack_830 = *(uint8_t **)(puVar33 + lVar30 + (ulong)(uVar18 * 0x90));
            apuStack_828[0] = *(uint8_t **)(puVar33 + lVar30 + (ulong)((uint)uVar10 * 0x90));
            kdf_init_x4_from_seed
                      (kdf,(uint8_t **)local_840,salt,(uint16_t *)local_980,uVar16,
                       lVar30 == 0 && iVar26 != 3 || lVar30 == 8 && iVar27 != 0,pp);
            lVar30 = lVar30 + 8;
            kdf = kdf + 1;
          } while (lVar30 == 8);
          if (iVar26 != 3) {
            local_840._0_8_ = *(undefined8 *)(puVar33 + (ulong)(uVar48 * 0x90) + 0x30);
            local_840._8_8_ = *(undefined8 *)(puVar33 + (ulong)(uVar17 * 0x90) + 0x30);
            puStack_830 = *(uint8_t **)(puVar33 + (ulong)(uVar18 * 0x90) + 0x30);
            apuStack_828[0] = *(uint8_t **)(puVar33 + (ulong)((uint)uVar10 * 0x90) + 0x30);
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,local_920);
          }
          uVar38 = local_850;
          if (iVar27 != 0) {
            local_840._0_8_ = *(undefined8 *)(puVar33 + (ulong)(uVar48 * 0x90) + 0x38);
            local_840._8_8_ = *(undefined8 *)(puVar33 + (ulong)(uVar17 * 0x90) + 0x38);
            puStack_830 = *(uint8_t **)(puVar33 + (ulong)(uVar18 * 0x90) + 0x38);
            apuStack_828[0] = *(uint8_t **)(puVar33 + (ulong)((uint)uVar10 * 0x90) + 0x38);
            Keccak_HashSqueezetimes4(&local_3c8,(BitSequence **)local_840,local_920);
          }
          lVar30 = local_858;
          uVar36 = local_8d0;
          lVar40 = 0;
          puVar33 = local_908;
          do {
            local_840._8_8_ = puVar33 + uVar31;
            puStack_830 = puVar33 + uVar38;
            apuStack_828[0] = puVar33 + lVar30;
            local_840._0_8_ = puVar33;
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)(local_700 + lVar40),(BitSequence **)local_840,
                       local_8d8);
            lVar40 = lVar40 + 0x338;
            puVar33 = puVar33 + uVar36;
          } while (lVar40 == 0x338);
          lVar30 = 0;
          uVar38 = local_930;
          puVar33 = local_908;
          do {
            puVar43 = local_938;
            uVar10 = puVar45[lVar30];
            if (iVar26 != 3) {
              *(byte *)(*(long *)(local_938 + (ulong)((uint)uVar10 * 0x90) + 0x30) + local_918) =
                   *(byte *)(*(long *)(local_938 + (ulong)((uint)uVar10 * 0x90) + 0x30) + local_918)
                   & bVar34;
            }
            mzd_from_char_array((mzd_local_t *)local_8c0,
                                *(uint8_t **)(local_938 + (ulong)((uint)uVar10 * 0x90) + 0x30),
                                uVar38);
            if (iVar27 != 0) {
              *(byte *)(*(long *)(puVar43 + (ulong)((uint)uVar10 * 0x90) + 0x38) + local_918) =
                   *(byte *)(*(long *)(puVar43 + (ulong)((uint)uVar10 * 0x90) + 0x38) + local_918) &
                   bVar34;
            }
            mzd_from_char_array((mzd_local_t *)local_8a0,
                                *(uint8_t **)(puVar43 + (ulong)((uint)uVar10 * 0x90) + 0x38),uVar38)
            ;
            uVar38 = local_8d0;
            pvVar25 = local_910;
            lVar40 = 0;
            puVar49 = puVar33;
            do {
              decompress_view(pvVar25,pp,puVar49,(uint)lVar40);
              views = local_900;
              lVar40 = lVar40 + 1;
              puVar49 = puVar49 + uVar38;
            } while (lVar40 == 1);
            decompress_view(local_900,pp,
                            *(uint8_t **)(puVar43 + (ulong)((uint)uVar10 * 0x90) + 0x50),1);
            data = (mzd_local_t (*) [1])local_8c0;
            (*local_8e0)(context->m_plaintext,views,(in_out_shares_t *)data,pvVar25,uVar37);
            compress_view(*(uint8_t **)(puVar43 + (ulong)((uint)uVar10 * 0x90) + 0x48),pp,views,0);
            uVar38 = local_930;
            uVar11 = (pp->lowmc).n;
            if ((~DAT_001c939c & 0x20400) == 0) {
              if (uVar11 < 0x81) {
                local_880._0_16_ =
                     vpternlogq_avx512vl(*(undefined1 (*) [16])context->m_key[0].w64,local_8a0,
                                         local_8c0._0_16_,0x96);
              }
              else {
                auVar23._16_16_ = auStack_890;
                auVar23._0_16_ = local_8a0;
                auVar21._16_16_ = local_8c0._16_16_;
                auVar21._0_16_ = local_8c0._0_16_;
                local_880._0_32_ =
                     vpternlogq_avx512vl(*(undefined1 (*) [32])context->m_key[0].w64,auVar23,auVar21
                                         ,0x96);
              }
            }
            else {
              local_880._0_16_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [16])context->m_key[0].w64,local_8a0,
                                       local_8c0._0_16_,0x96);
              if (0x80 < uVar11) {
                local_880._16_16_ =
                     vpternlogq_avx512vl(*(undefined1 (*) [16])(context->m_key[0].w64 + 2),
                                         auStack_890,local_8c0._16_16_,0x96);
              }
            }
            lVar40 = 0;
            do {
              mzd_to_char_array(*(uint8_t **)
                                 (puVar43 + lVar40 * 8 + (ulong)((uint)uVar10 * 0x90) + 0x60),*data,
                                uVar38);
              lVar40 = lVar40 + 1;
              data = data + 1;
            } while (lVar40 == 1);
            mzd_to_char_array(*(uint8_t **)(puVar43 + (ulong)((uint)uVar10 * 0x90) + 0x70),
                              (mzd_local_t *)local_880,uVar38);
            lVar30 = lVar30 + 1;
            puVar33 = puVar33 + uVar31;
          } while (lVar30 != 4);
          lVar30 = 0;
          do {
            bVar2 = pp->digest_size;
            uVar10 = *puVar45;
            uVar11 = puVar45[1];
            uVar12 = puVar45[2];
            uVar13 = puVar45[3];
            local_980[0] = 4;
            if (bVar2 == 0x20) {
              uVar48 = 0x540;
              uVar41 = 0x100;
            }
            else {
              uVar48 = 0x440;
              uVar41 = 0x200;
            }
            Keccak_HashInitializetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,uVar48,uVar41,0,'\x1f');
            local_840._0_8_ = local_720._0_8_;
            local_840._8_8_ = local_720._8_8_;
            puStack_830 = (uint8_t *)local_720._16_8_;
            apuStack_828[0] = (uint8_t *)local_720._24_8_;
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,8);
            uVar41 = (uint)uVar10;
            local_840._0_8_ = *(undefined8 *)(local_8c8 + lVar30 + -0x30 + (ulong)(uVar41 * 0x90));
            uVar48 = (uint)uVar11;
            local_840._8_8_ = *(undefined8 *)(local_8c8 + lVar30 + -0x30 + (ulong)(uVar48 * 0x90));
            uVar17 = (uint)uVar12;
            puStack_830 = *(uint8_t **)(local_8c8 + lVar30 + -0x30 + (ulong)(uVar17 * 0x90));
            uVar18 = (uint)uVar13;
            apuStack_828[0] = *(uint8_t **)(local_8c8 + lVar30 + -0x30 + (ulong)(uVar18 * 0x90));
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,
                       (ulong)pp->seed_size << 3);
            Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
            auVar1 = _local_980;
            local_980._8_8_ = local_800;
            local_980._0_8_ = local_840;
            puStack_970 = local_7c0;
            auStack_960 = auVar1._32_32_;
            puStack_968 = auStack_780;
            uVar38 = (ulong)((uint)bVar2 * 8);
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,uVar38);
            if (bVar2 == 0x20) {
              uVar39 = 0x540;
              uVar35 = 0x100;
            }
            else {
              uVar39 = 0x440;
              uVar35 = 0x200;
            }
            Keccak_HashInitializetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,uVar39,uVar35,0,'\x1f');
            _local_980 = local_740;
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,8);
            local_980._8_8_ = local_800;
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,uVar38);
            puVar33 = local_8c8;
            local_980._8_8_ = *(undefined8 *)(local_8c8 + lVar30 + (ulong)(uVar48 * 0x90));
            local_980._0_8_ = *(undefined8 *)(local_8c8 + lVar30 + (ulong)(uVar41 * 0x90));
            puStack_970 = (undefined1 *)*(undefined8 *)(local_8c8 + lVar30 + (ulong)(uVar17 * 0x90))
            ;
            puStack_968 = (undefined1 *)*(undefined8 *)(local_8c8 + lVar30 + (ulong)(uVar18 * 0x90))
            ;
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                       (ulong)pp->input_output_size << 3);
            local_980._8_8_ = *(undefined8 *)(puVar33 + lVar30 + 0x18 + (ulong)(uVar48 * 0x90));
            local_980._0_8_ = *(undefined8 *)(puVar33 + lVar30 + 0x18 + (ulong)(uVar41 * 0x90));
            puStack_970 = (undefined1 *)
                          *(undefined8 *)(puVar33 + lVar30 + 0x18 + (ulong)(uVar17 * 0x90));
            puStack_968 = (undefined1 *)
                          *(undefined8 *)(puVar33 + lVar30 + 0x18 + (ulong)(uVar18 * 0x90));
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                       (ulong)pp->view_size << 3);
            local_980._8_8_ = *(undefined8 *)(puVar33 + lVar30 + 0x30 + (ulong)(uVar48 * 0x90));
            local_980._0_8_ = *(undefined8 *)(puVar33 + lVar30 + 0x30 + (ulong)(uVar41 * 0x90));
            puStack_970 = (undefined1 *)
                          *(undefined8 *)(puVar33 + lVar30 + 0x30 + (ulong)(uVar17 * 0x90));
            puStack_968 = (undefined1 *)
                          *(undefined8 *)(puVar33 + lVar30 + 0x30 + (ulong)(uVar18 * 0x90));
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                       (ulong)pp->input_output_size << 3);
            Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
            local_980._8_8_ = *(undefined8 *)(puVar33 + lVar30 + -0x18 + (ulong)(uVar48 * 0x90));
            local_980._0_8_ = *(undefined8 *)(puVar33 + lVar30 + -0x18 + (ulong)(uVar41 * 0x90));
            puStack_970 = (undefined1 *)
                          *(undefined8 *)(puVar33 + lVar30 + -0x18 + (ulong)(uVar17 * 0x90));
            puStack_968 = (undefined1 *)
                          *(undefined8 *)(puVar33 + lVar30 + -0x18 + (ulong)(uVar18 * 0x90));
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,uVar38);
            lVar30 = lVar30 + 8;
          } while (lVar30 == 8);
          if (context->unruh == true) {
            lVar30 = 0;
            do {
              bVar51 = uVar37 == 1 && lVar30 == 8 || lVar30 == 0 && uVar37 == 2;
              bVar2 = pp->digest_size;
              uVar10 = *puVar45;
              uVar11 = puVar45[1];
              uVar12 = puVar45[2];
              uVar13 = puVar45[3];
              local_980[0] = 5;
              if (bVar2 == 0x20) {
                uVar48 = 0x540;
                uVar41 = 0x100;
              }
              else {
                uVar48 = 0x440;
                uVar41 = 0x200;
              }
              Keccak_HashInitializetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,uVar48,uVar41,0,'\x1f');
              local_840._0_8_ = local_720._0_8_;
              local_840._8_8_ = local_720._8_8_;
              puStack_830 = (uint8_t *)local_720._16_8_;
              apuStack_828[0] = (uint8_t *)local_720._24_8_;
              Keccak_HashUpdatetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,8);
              uVar41 = (uint)uVar10;
              local_840._0_8_ = *(undefined8 *)(local_940 + lVar30 + -0x78 + (ulong)(uVar41 * 0x90))
              ;
              uVar48 = (uint)uVar11;
              local_840._8_8_ = *(undefined8 *)(local_940 + lVar30 + -0x78 + (ulong)(uVar48 * 0x90))
              ;
              uVar17 = (uint)uVar12;
              puStack_830 = *(uint8_t **)(local_940 + lVar30 + -0x78 + (ulong)(uVar17 * 0x90));
              uVar18 = (uint)uVar13;
              apuStack_828[0] = *(uint8_t **)(local_940 + lVar30 + -0x78 + (ulong)(uVar18 * 0x90));
              Keccak_HashUpdatetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,
                         (ulong)pp->seed_size << 3);
              Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
              auVar1 = _local_980;
              local_980._8_8_ = local_800;
              local_980._0_8_ = local_840;
              puStack_970 = local_7c0;
              auStack_960 = auVar1._32_32_;
              puStack_968 = auStack_780;
              Keccak_HashSqueezetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                         (ulong)((uint)bVar2 * 8));
              if (bVar2 == 0x20) {
                uVar39 = 0x540;
                uVar35 = 0x100;
              }
              else {
                uVar39 = 0x440;
                uVar35 = 0x200;
              }
              Keccak_HashInitializetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,uVar39,uVar35,0,'\x1f');
              local_980._8_8_ = local_800;
              local_980._0_8_ = local_840;
              Keccak_HashUpdatetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                         (ulong)((uint)bVar2 * 8));
              puVar33 = local_940;
              if (bVar51) {
                local_980._8_8_ =
                     *(undefined8 *)(local_940 + lVar30 + -0x48 + (ulong)(uVar48 * 0x90));
                local_980._0_8_ =
                     *(undefined8 *)(local_940 + lVar30 + -0x48 + (ulong)(uVar41 * 0x90));
                puStack_970 = (undefined1 *)
                              *(undefined8 *)(local_940 + lVar30 + -0x48 + (ulong)(uVar17 * 0x90));
                puStack_968 = (undefined1 *)
                              *(undefined8 *)(local_940 + lVar30 + -0x48 + (ulong)(uVar18 * 0x90));
                Keccak_HashUpdatetimes4
                          ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                           (ulong)pp->input_output_size << 3);
              }
              local_980._8_8_ = *(undefined8 *)(puVar33 + lVar30 + -0x30 + (ulong)(uVar48 * 0x90));
              local_980._0_8_ = *(undefined8 *)(puVar33 + lVar30 + -0x30 + (ulong)(uVar41 * 0x90));
              puStack_970 = (undefined1 *)
                            *(undefined8 *)(puVar33 + lVar30 + -0x30 + (ulong)(uVar17 * 0x90));
              puStack_968 = (undefined1 *)
                            *(undefined8 *)(puVar33 + lVar30 + -0x30 + (ulong)(uVar18 * 0x90));
              Keccak_HashUpdatetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                         (ulong)pp->view_size << 3);
              bVar2 = pp->view_size;
              bVar3 = pp->input_output_size;
              uVar35 = 0;
              if (bVar51) {
                uVar35 = (uint)bVar3;
              }
              _local_980 = local_740;
              Keccak_HashUpdatetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,0x10);
              Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
              local_980._8_8_ = *(undefined8 *)(puVar33 + lVar30 + (ulong)(uVar48 * 0x90));
              local_980._0_8_ = *(undefined8 *)(puVar33 + lVar30 + (ulong)(uVar41 * 0x90));
              puStack_970 = (undefined1 *)*(undefined8 *)(puVar33 + lVar30 + (ulong)(uVar17 * 0x90))
              ;
              puStack_968 = (undefined1 *)*(undefined8 *)(puVar33 + lVar30 + (ulong)(uVar18 * 0x90))
              ;
              Keccak_HashSqueezetimes4
                        ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                         (ulong)(((uint)bVar2 + (uint)bVar3 + uVar35) * 8));
              lVar30 = lVar30 + 8;
            } while (lVar30 == 8);
          }
          uVar41 = local_8f8 + 4;
          puVar45 = puVar45 + 4;
          puVar33 = local_938;
        } while (uVar41 < (uint)local_848);
      }
      if (uVar44 < local_924) {
        iVar27 = uVar37 + 1;
        iVar26 = 0;
        if (iVar27 != 3) {
          iVar26 = iVar27;
        }
        iVar28 = uVar37 + 2 + ((uVar37 + 2) / 3) * -3;
        do {
          prf_round = (proof_round_t *)(puVar33 + (uint)*puVar45 * 0x90);
          kdf_00 = (kdf_shake_t *)local_700;
          lVar30 = 0;
          do {
            uVar16 = (uint16_t)iVar26;
            if (lVar30 == 0) {
              uVar16 = (uint16_t)uVar37;
            }
            kdf_init_from_seed(kdf_00,prf_round->seeds[lVar30],salt,*puVar45,uVar16,
                               lVar30 == 0 && iVar27 != 3 || lVar30 == 1 && iVar28 != 0,pp);
            lVar30 = lVar30 + 1;
            kdf_00 = kdf_00 + 1;
          } while (lVar30 == 1);
          if (iVar27 != 3) {
            Keccak_HashSqueeze((Keccak_HashInstance *)local_700,prf_round->input_shares[0],local_920
                              );
            prf_round->input_shares[0][local_918] = prf_round->input_shares[0][local_918] & bVar34;
          }
          if (iVar28 != 0) {
            Keccak_HashSqueeze((Keccak_HashInstance *)(local_640 + 0x20),prf_round->input_shares[1],
                               local_920);
            prf_round->input_shares[1][local_918] = prf_round->input_shares[1][local_918] & bVar34;
          }
          uVar38 = local_930;
          mzd_from_char_array((mzd_local_t *)local_8c0,prf_round->input_shares[0],local_930);
          mzd_from_char_array((mzd_local_t *)local_8a0,prf_round->input_shares[1],uVar38);
          databitlen = local_8d8;
          instance = (Keccak_HashInstance *)local_700;
          lVar30 = 0;
          do {
            Keccak_HashSqueeze(instance,local_840,databitlen);
            decompress_view(local_910,pp,local_840,(uint)lVar30);
            pvVar25 = local_900;
            lVar30 = lVar30 + 1;
            instance = instance + 1;
          } while (lVar30 == 1);
          decompress_view(local_900,pp,prf_round->communicated_bits[1],1);
          (*local_8e0)(context->m_plaintext,pvVar25,(in_out_shares_t *)local_8c0,local_910,uVar37);
          compress_view(prf_round->communicated_bits[0],pp,pvVar25,0);
          uVar38 = local_930;
          uVar10 = (pp->lowmc).n;
          if ((~DAT_001c939c & 0x20400) == 0) {
            if (uVar10 < 0x81) {
              local_880._0_16_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [16])context->m_key[0].w64,local_8a0,
                                       local_8c0._0_16_,0x96);
            }
            else {
              auVar24._16_16_ = auStack_890;
              auVar24._0_16_ = local_8a0;
              auVar22._16_16_ = local_8c0._16_16_;
              auVar22._0_16_ = local_8c0._0_16_;
              local_880._0_32_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [32])context->m_key[0].w64,auVar24,auVar22,
                                       0x96);
            }
          }
          else {
            local_880._0_16_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [16])context->m_key[0].w64,local_8a0,
                                     local_8c0._0_16_,0x96);
            if (0x80 < uVar10) {
              local_880._16_16_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [16])(context->m_key[0].w64 + 2),auStack_890
                                       ,local_8c0._16_16_,0x96);
            }
          }
          data_00 = (mzd_local_t *)local_8c0;
          lVar30 = 0;
          do {
            mzd_to_char_array(prf_round->output_shares[lVar30],data_00,uVar38);
            hash_commitment(pp,prf_round,(uint)lVar30);
            lVar30 = lVar30 + 1;
            data_00 = data_00 + 1;
          } while (lVar30 == 1);
          mzd_to_char_array(prf_round->output_shares[2],(mzd_local_t *)local_880,uVar38);
          uVar41 = local_924;
          if (context->unruh == true) {
            uVar48 = 0;
            do {
              unruh_G(pp,prf_round,uVar48,uVar48 == 1 && uVar37 == 1 || uVar37 == 2 && uVar48 == 0);
              uVar48 = uVar48 + 1;
            } while (uVar48 == 1);
          }
          uVar44 = uVar44 + 1;
          puVar45 = puVar45 + 1;
          puVar33 = local_938;
        } while (uVar44 != uVar41);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != 3);
    auVar52 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar52);
    auStack_580 = auVar1._10_54_;
    auVar1 = vmovdqa64_avx512f(auVar52);
    auStack_5c0 = auVar1._0_54_;
    local_58a = auVar1._54_10_;
    local_600 = vmovdqa64_avx512f(auVar52);
    local_640 = vmovdqa64_avx512f(auVar52);
    local_680 = vmovdqa64_avx512f(auVar52);
    local_700._64_64_ = vmovdqa64_avx512f(auVar52);
    local_700._0_64_ = vmovdqa64_avx512f(auVar52);
    bVar34 = pp->digest_size;
    uVar9 = pp->num_rounds;
    uVar31 = (ulong)uVar9;
    bVar2 = pp->input_output_size;
    local_980[0] = 1;
    if (bVar34 == 0x20) {
      uVar32 = 0x540;
      uVar37 = 0x100;
    }
    else {
      uVar32 = 0x440;
      uVar37 = 0x200;
    }
    Keccak_HashInitialize((Keccak_HashInstance *)local_840,uVar32,uVar37,0,'\x1f');
    Keccak_HashUpdate((Keccak_HashInstance *)local_840,local_980,8);
    if (uVar31 != 0) {
      uVar38 = (ulong)((uint)bVar2 * 8);
      puVar33 = salt + 0x88;
      uVar36 = 0;
      puVar43 = local_938;
      do {
        if (*(char *)(*(long *)(salt + 0x20) + uVar36) == '\x01') {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 0x10),
                            uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar33,uVar38);
          puVar49 = puVar43 + 0x68;
        }
        else if (*(char *)(*(long *)(salt + 0x20) + uVar36) == '\0') {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar33,uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 8),uVar38);
          puVar49 = puVar43 + 0x70;
        }
        else {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 8),uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 0x10),
                            uVar38);
          puVar49 = puVar33;
        }
        Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar49,uVar38);
        uVar36 = uVar36 + 1;
        puVar43 = puVar43 + 0x90;
        puVar33 = puVar33 + 0x90;
      } while (uVar31 != uVar36);
      uVar38 = (ulong)((uint)bVar34 * 8);
      puVar33 = salt + 0x40;
      uVar36 = 0;
      puVar43 = local_938;
      do {
        if (*(char *)(*(long *)(salt + 0x20) + uVar36) == '\x01') {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 0x10),
                            uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar33,uVar38);
          puVar49 = puVar43 + 0x20;
        }
        else if (*(char *)(*(long *)(salt + 0x20) + uVar36) == '\0') {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar33,uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 8),uVar38);
          puVar49 = puVar43 + 0x28;
        }
        else {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 8),uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar33 + 0x10),
                            uVar38);
          puVar49 = puVar33;
        }
        Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar49,uVar38);
        uVar36 = uVar36 + 1;
        puVar43 = puVar43 + 0x90;
        puVar33 = puVar33 + 0x90;
      } while (uVar31 != uVar36);
    }
    if ((context->unruh & uVar9 != 0) != 0) {
      iVar26 = (uint)pp->view_size + (uint)bVar2;
      uVar38 = (ulong)(uint)(iVar26 * 8);
      uVar36 = 0;
      puVar33 = local_938;
      do {
        puVar43 = local_940;
        if (*(char *)(*(long *)(salt + 0x20) + uVar36) == '\x01') {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(local_940 + 0x10),
                            uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar43,uVar38);
          puVar49 = puVar33 + 0x80;
        }
        else if (*(char *)(*(long *)(salt + 0x20) + uVar36) == '\0') {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)local_940,uVar38);
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar43 + 8),uVar38);
          puVar49 = puVar33 + 0x88;
        }
        else {
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(local_940 + 8),uVar38
                           );
          Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)(puVar43 + 0x10),
                            uVar38);
          puVar49 = puVar43;
        }
        Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar49,
                          (ulong)(((uint)bVar2 + iVar26) * 8));
        uVar36 = uVar36 + 1;
        puVar33 = puVar33 + 0x90;
        local_940 = puVar43 + 0x90;
      } while (uVar31 != uVar36);
    }
    H3_public_key_message((hash_context *)local_840,pp,salt,context);
    Keccak_HashFinal((hash_context *)local_840,(BitSequence *)0x0);
    _local_980 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    Keccak_HashSqueeze((hash_context *)local_840,local_980,(ulong)bVar34 << 3);
    H3_compute(pp,local_980,local_700);
    iVar26 = memcmp(local_700,*(void **)(salt + 0x20),(ulong)pp->num_rounds);
    free(local_908);
    free(local_8e8);
    free(local_910);
    free(local_900);
    free(*(void **)(salt + 0x20));
    free(salt);
  }
  return iVar26;
}

Assistant:

int picnic_impl_verify(const picnic_instance_t* pp, const picnic_context_t* context,
                       const uint8_t* sig, size_t siglen) {
  sig_proof_t* prf = sig_proof_from_char_array(pp, context, sig, siglen);
  if (!prf) {
    return -1;
  }

  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_verify_implementation_f lowmc_verify_impl =
      get_zkbpp_lowmc_verify_implementation(&pp->lowmc);

  in_out_shares_t in_out_shares;
  view_t* views = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);
  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for and-gates

  // sort the different challenge rounds based on their H3 index, so we can use the 4x Keccak when
  // verifying since all of this is public information, there is no leakage
  sorting_helper_t* sorted_rounds = malloc(sizeof(sorting_helper_t) * num_rounds);

  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_VERIFY * 4 * aview_size);
  for (unsigned int current_chal = 0; current_chal < 3; current_chal++) {
    unsigned int num_current_rounds = 0;
    for (unsigned int r = 0; r < num_rounds; r++) {
      if (prf->challenge[r] == current_chal) {
        sorted_rounds[num_current_rounds++] = r;
      }
    }
    unsigned int i                 = 0;
    const sorting_helper_t* helper = sorted_rounds;
    for (; i < (num_current_rounds / 4) * 4; i += 4, helper += 4) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      const proof_round_t* prf0 = &prf->round[helper[0]];
      const proof_round_t* prf1 = &prf->round[helper[1]];
      const proof_round_t* prf2 = &prf->round[helper[2]];
      const proof_round_t* prf3 = &prf->round[helper[3]];

      {
        kdf_shake_x4_t kdfs[SC_VERIFY];
        const uint16_t round_numbers[4] = {helper[0], helper[1], helper[2], helper[3]};
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          const uint8_t* seeds[4]          = {prf0->seeds[j], prf1->seeds[j], prf2->seeds[j],
                                              prf3->seeds[j]};
          kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, player_number,
                                include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[0], prf0->input_shares[0], prf1->input_shares[0],
                                        prf2->input_shares[0], prf3->input_shares[0],
                                        input_output_size);
        }
        if (c_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[1], prf0->input_shares[1], prf1->input_shares[1],
                                        prf2->input_shares[1], prf3->input_shares[1],
                                        input_output_size);
        }
        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
          kdf_shake_x4_clear(&kdfs[j]);
        }
      }

      for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
        proof_round_t* round = &prf->round[helper[round_offset]];

        if (b_i) {
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        if (c_i) {
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
        }

        decompress_view(views, pp, round->communicated_bits[1], 1);
        // perform ZKB++ LowMC evaluation
        lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
        compress_view(round->communicated_bits[0], pp, views, 0);

        mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                  context->m_key);
        // recompute commitments
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        }
        mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                          input_output_size);
      }
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        hash_commitment_x4_verify(pp, prf->round, helper, j);
      }
#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G_x4_verify(pp, prf->round, helper, j,
                            (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
    for (; i < num_current_rounds; ++i, ++helper) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      proof_round_t* round = &prf->round[*helper];
      {
        kdf_shake_t kdfs[SC_VERIFY];
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, *helper, player_number,
                             include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_get_randomness(&kdfs[0], round->input_shares[0], input_output_size);
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        if (c_i) {
          kdf_shake_get_randomness(&kdfs[1], round->input_shares[1], input_output_size);
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }

        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          assert(view_size <= MAX_VIEW_SIZE);
          uint8_t tape_bytes[MAX_VIEW_SIZE];
          kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
          decompress_random_tape(rvec, pp, tape_bytes, j);
        }

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_clear(&kdfs[j]);
        }
      }

      decompress_view(views, pp, round->communicated_bits[1], 1);
      // perform ZKB++ LowMC evaluation
      lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
      compress_view(round->communicated_bits[0], pp, views, 0);

      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      // recompute commitments
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        hash_commitment(pp, round, j);
      }
      mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                        input_output_size);

#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G(pp, round, j, (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
  }

  assert(pp->num_rounds <= MAX_NUM_ROUNDS);
  unsigned char challenge[MAX_NUM_ROUNDS] = {0};
  H3_verify(pp, prf, context, challenge);
  const int success_status = memcmp(challenge, prf->challenge, pp->num_rounds);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  free(sorted_rounds);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);

  proof_free(prf);

  return success_status;
}